

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomx.cpp
# Opt level: O0

void randomx_release_cache(randomx_cache *cache)

{
  randomx_cache *in_RDI;
  
  if (in_RDI->memory != (uint8_t *)0x0) {
    (*in_RDI->dealloc)(in_RDI);
  }
  if (in_RDI != (randomx_cache *)0x0) {
    randomx_cache::~randomx_cache(in_RDI);
    operator_delete(in_RDI);
  }
  return;
}

Assistant:

void randomx_release_cache(randomx_cache* cache) {
		assert(cache != nullptr);
		if (cache->memory != nullptr) {
			cache->dealloc(cache);
		}
		delete cache;
	}